

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

void __thiscall
BssSection_RoundTripForPopulated_Test::TestBody(BssSection_RoundTripForPopulated_Test *this)

{
  small_vector<unsigned_char,_128UL> *this_00;
  undefined8 uVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_01;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  char *pcVar3;
  pointer pcVar4;
  section_content *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  section_kind kind;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  string exported_json;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  section_content imported_content;
  string_mapping exported_names;
  parser<pstore::exchange::import_ns::callbacks> parser;
  section_content exported_content;
  string_mapping imported_names;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *in_stack_fffffffffffffa48;
  AssertHelper local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_5a0;
  section_kind local_591;
  AssertHelper local_590;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [7];
  pointer local_500;
  pointer local_4f0;
  undefined1 local_4e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [7];
  pointer local_458;
  pointer local_448;
  undefined1 local_438 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined8 local_408;
  string_mapping local_400;
  void *local_368;
  long local_358;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_350;
  void *local_348;
  void *pvStack_340;
  long local_338;
  void *pvStack_330;
  void *local_328;
  long lStack_320;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_318;
  parser<pstore::exchange::import_ns::callbacks> local_2e0;
  section_content local_238;
  undefined1 local_158 [56];
  _List_node_base *local_120;
  pointer local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __node_base local_100;
  uint64_t uStack_f8;
  float local_f0;
  size_t local_e8;
  mutex_type *apmStack_e0 [2];
  undefined1 local_d0 [152];
  pointer local_38;
  
  local_591 = bss;
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&local_318);
  this_00 = &local_238.data;
  local_238.kind = bss;
  local_238.align = '\x01';
  memset(this_00,0,0xa0);
  local_238.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.align = ' ';
  local_238.data.buffer_ = local_238.data.small_buffer_._M_elems;
  pstore::small_vector<unsigned_char,_128UL>::resize(this_00,7);
  export_section<(pstore::repo::section_kind)2>
            ((string *)local_438,&(this->super_BssSection).export_db_,(string_mapping *)&local_318,
             &local_238,false);
  local_158._24_8_ = (long)local_158 + 0x18;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_158._48_8_ = local_158 + 0x30;
  local_118 = (pointer)0x0;
  local_110 = (element_type *)apmStack_e0;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_100._M_nxt = (_Hash_node_base *)0x0;
  uStack_f8 = 0;
  local_f0 = 1.0;
  local_e8 = 0;
  apmStack_e0[0] = (mutex_type *)0x0;
  local_400.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_418;
  local_408 = 0;
  local_418._M_allocated_capacity = 0;
  local_418._8_8_ = 0;
  local_400.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x100;
  local_158._32_8_ = local_158._24_8_;
  local_120 = (_List_node_base *)local_158._48_8_;
  memset((pointer *)
         ((long)&local_400.adder_.views_.
                 super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10),0,0xa0);
  local_348 = (void *)0x0;
  pvStack_340 = (void *)0x0;
  local_338 = 0;
  pvStack_330 = (void *)0x0;
  local_328 = (void *)0x0;
  lStack_320 = 0;
  local_350 = &local_400.strings_;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            (&local_2e0,(_anonymous_namespace_ *)&(this->super_BssSection).import_db_,
             (database *)local_158,(char)&local_400 + mergeable_const_8,&local_400,in_R9,
             in_stack_fffffffffffffa48);
  uVar1 = local_438._0_8_;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_588,local_438._8_8_)
  ;
  local_588._8_8_ = uVar1;
  this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>(&local_2e0,(span<const_char,__1L> *)local_588);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_01);
  local_5b0.data_._0_4_ = CONCAT31(local_5b0.data_._1_3_,local_2e0.error_._M_value == 0);
  local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2e0.error_._M_value == 0) {
    local_4e0 = (undefined1  [8])((long)(local_418._8_8_ - local_418._0_8_) >> 3);
    local_5b0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_588,"dispatchers.size ()","1U",(unsigned_long *)local_4e0,
               (uint *)&local_5b0);
    if (local_588[0] != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_588 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_588._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_588,"dispatchers.front ()->kind ()","kind",
                 (section_kind *)(*(long *)local_418._M_allocated_capacity + 8),&local_591);
      if (local_588[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_4e0 + 0x10),
                   "The creation dispatcher should be able to create a text section",0x3f);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((_Alloc_hider *)local_588._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x97,pcVar3);
        testing::internal::AssertHelper::operator=(&local_5b0,(Message *)local_4e0);
        testing::internal::AssertHelper::~AssertHelper(&local_5b0);
        if (local_4e0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_4e0 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_588 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_588._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_588,"imported_content.kind","exported_content.kind",
                 (section_kind *)
                 ((long)&local_400.adder_.views_.
                         super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                         ._M_impl.super__Vector_impl_data + 8),&local_238.kind);
      if (local_588[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4e0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((_Alloc_hider *)local_588._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_5b0,(Message *)local_4e0);
        testing::internal::AssertHelper::~AssertHelper(&local_5b0);
        if (local_4e0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_4e0 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_588 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_588._8_8_);
      }
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)local_588,"imported_content.align","exported_content.align",
                 (uchar *)((long)&local_400.adder_.views_.
                                  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 9),&local_238.align);
      if (local_588[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4e0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((_Alloc_hider *)local_588._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_5b0,(Message *)local_4e0);
        testing::internal::AssertHelper::~AssertHelper(&local_5b0);
        if (local_4e0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_4e0 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_588 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_588._8_8_);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_588,this_00);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_d0,
                 (small_vector<unsigned_char,_128UL> *)local_588);
      if (local_500 != (pointer)0x0) {
        operator_delete(local_500,(long)local_4f0 - (long)local_500);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_588,
                 (small_vector<unsigned_char,_128UL> *)local_d0);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_4e0,
                 (small_vector<unsigned_char,_128UL> *)local_588);
      if (local_500 != (pointer)0x0) {
        operator_delete(local_500,(long)local_4f0 - (long)local_500);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
      ::operator()(&local_5b0,local_4e0,
                   (small_vector<unsigned_char,_128UL> *)"imported_content.data");
      if (local_458 != (pointer)0x0) {
        operator_delete(local_458,(long)local_448 - (long)local_458);
      }
      if ((void *)local_d0._136_8_ != (void *)0x0) {
        operator_delete((void *)local_d0._136_8_,(long)local_38 - local_d0._136_8_);
      }
      if (local_5b0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_588);
        if (local_5a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_5a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e0,(Message *)local_588);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_588._0_8_ + 8))();
        }
      }
      if (local_5a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_5a8,local_5a8);
      }
      local_4e0[0] = (internal)(local_348 == pvStack_340);
      local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_348 != pvStack_340) {
        testing::Message::Message((Message *)&local_5b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_588,(internal *)local_4e0,
                   (AssertionResult *)"imported_content.ifixups.empty ()","false","true",
                   (char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_5a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9d,(char *)local_588._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a0,(Message *)&local_5b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != local_578) {
          operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_5b0.data_._4_4_,local_5b0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_5b0.data_._4_4_,local_5b0.data_._0_4_) + 8))();
        }
      }
      if (local_4d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4d8,local_4d8);
      }
      this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_4d8;
      local_4e0[0] = (internal)(pvStack_330 == local_328);
      local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      __ptr_00 = local_4d8;
      if (pvStack_330 != local_328) {
        testing::Message::Message((Message *)&local_5b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_588,(internal *)local_4e0,
                   (AssertionResult *)"imported_content.xfixups.empty ()","false","true",
                   (char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_5a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9e,(char *)local_588._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a0,(Message *)&local_5b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != local_578) {
          operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity + 1);
        }
        __ptr_00 = local_4d8;
        if ((long *)CONCAT44(local_5b0.data_._4_4_,local_5b0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_5b0.data_._4_4_,local_5b0.data_._0_4_) + 8))();
          __ptr_00 = local_4d8;
        }
      }
      goto LAB_0012d930;
    }
    testing::Message::Message((Message *)local_4e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_4e0 + 0x10),
               "Expected a single creation dispatcher to be added to the dispatchers container",0x4e
              );
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_588._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5b0,(Message *)local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    if (local_4e0 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_4e0 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0012d93d;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_588 + 8);
    __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588._8_8_;
  }
  else {
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_5a8;
    testing::Message::Message((Message *)&local_5a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5a0._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_2e0.error_._M_cat + 0x20))
              (local_588,local_2e0.error_._M_cat,local_2e0.error_._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5a0._M_head_impl + 0x10),(char *)local_588._0_8_,local_588._8_8_);
    local_4e0[0] = (internal)0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5a0._M_head_impl + 0x10),local_4e0,1);
    local_4e0[0] = (internal)0x28;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_5a0._M_head_impl + 0x10),local_4e0,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_4e0[0] = (internal)0x3a;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_4e0,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_4e0[0] = (internal)0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_4e0,1);
    local_4e0[0] = (internal)0xa;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5a0._M_head_impl + 0x10),local_4e0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5a0._M_head_impl + 0x10),(char *)local_438._0_8_,local_438._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4e0,(internal *)&local_5b0,(AssertionResult *)0x1df922,"true","false"
               ,(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x91,(char *)local_4e0);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if (local_4e0 != (undefined1  [8])local_4d0) {
      operator_delete((void *)local_4e0,local_4d0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ != local_578) {
      operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity + 1);
    }
    __ptr_00 = local_5a8;
    if (local_5a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5a0._M_head_impl + 8))();
      __ptr_00 = local_5a8;
    }
LAB_0012d930:
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012d93d;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_02,__ptr_00);
LAB_0012d93d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.string_._M_dataplus._M_p != &local_2e0.string_.field_2) {
    operator_delete(local_2e0.string_._M_dataplus._M_p,
                    local_2e0.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_2e0.stack_.c);
  if (local_2e0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_2e0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if (pvStack_330 != (void *)0x0) {
    operator_delete(pvStack_330,lStack_320 - (long)pvStack_330);
  }
  if (local_348 != (void *)0x0) {
    operator_delete(local_348,local_338 - (long)local_348);
  }
  if (local_368 != (void *)0x0) {
    operator_delete(local_368,local_358 - (long)local_368);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&local_418);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_158);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_438 + 0x10)) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (local_238.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_318);
  return;
}

Assistant:

TEST_F (BssSection, RoundTripForPopulated) {
    constexpr auto kind = pstore::repo::section_kind::bss;
    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::bss_section>::value,
                   "Expected bss to map to bss_section");

    pstore::exchange::export_ns::string_mapping exported_names{
        export_db_, pstore::exchange::export_ns::name_index_tag ()};

    pstore::repo::section_content exported_content{kind};
    exported_content.align = 32U;
    exported_content.data.resize (7);

    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, false);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    pstore::exchange::import_ns::string_mapping imported_names;

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a BSS section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer =
        pstore::exchange::import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ()
                                       << ' ' << parser.coordinate () << '\n'
                                       << exported_json;

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (imported_content.kind, exported_content.kind);
    EXPECT_EQ (imported_content.align, exported_content.align);
    EXPECT_THAT (imported_content.data, testing::ContainerEq (exported_content.data));
    EXPECT_TRUE (imported_content.ifixups.empty ());
    EXPECT_TRUE (imported_content.xfixups.empty ());
}